

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pid.c
# Opt level: O2

void cleanup(EVP_PKEY_CTX *ctx)

{
  gvector in_RDX;
  inform_dist *in_RSI;
  size_t i;
  ulong uVar1;
  size_t i_1;
  
  if (ctx != (EVP_PKEY_CTX *)0x0) {
    for (uVar1 = 0; uVar1 < *(ulong *)(ctx + -8); uVar1 = uVar1 + 1) {
      gvector_free(*(gvector *)(ctx + uVar1 * 8));
    }
    gvector_free(ctx);
  }
  if (in_RSI != (inform_dist *)0x0) {
    inform_dist_free(in_RSI);
  }
  if (in_RDX != (gvector)0x0) {
    for (uVar1 = 0; uVar1 < *(ulong *)((long)in_RDX + -8); uVar1 = uVar1 + 1) {
      gvector_free(*(gvector *)((long)in_RDX + uVar1 * 8));
    }
    gvector_free(in_RDX);
    return;
  }
  return;
}

Assistant:

static void cleanup(size_t **subsets, inform_dist *s_dist, double **info)
{
    if (subsets)
    {
        for (size_t i = 0; i < gvector_len(subsets); ++i)
        {
            gvector_free(subsets[i]);
        }
        gvector_free(subsets);
    }

    if (s_dist)
    {
        inform_dist_free(s_dist);
    }

    if (info)
    {
        for (size_t i = 0; i < gvector_len(info); ++i)
        {
            gvector_free(info[i]);
        }
        gvector_free(info);
    }
}